

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::mouseDoubleClickEvent(QLineEdit *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QLineEditPrivate *this_00;
  bool bVar5;
  int iVar6;
  int iVar7;
  QPoint QVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  QArrayData *local_50;
  int local_40;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (*(int *)(e + 0x40) != 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
      QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
      return;
    }
    goto LAB_00419e12;
  }
  dVar9 = (double)QEventPoint::position();
  dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar9;
  bVar5 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  iVar6 = QLineEditPrivate::xToPos
                    (this_00,(int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                          ~-(ulong)bVar5 & (ulong)dVar9),CursorBetweenCharacters);
  bVar5 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
  if (bVar5) {
    iVar1 = this_00->control->m_cursor;
    QTextLayout::preeditAreaText();
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,2,0x10);
      }
    }
    iVar2 = (int)(this_00->control->m_text).d.size;
    QWidgetLineControl::commitPreedit((QWidgetLineControl *)this_00->control);
    iVar3 = (int)(this_00->control->m_text).d.size;
    iVar7 = iVar3 - iVar2;
    if (local_40 < iVar6 - iVar1 || iVar6 - iVar1 < 0) {
      if (iVar1 < iVar6) {
        iVar6 = (iVar6 - local_40) + iVar7;
      }
      goto LAB_00419d25;
    }
    if (iVar3 != iVar2) {
      iVar7 = iVar7 + iVar1;
      if (iVar6 <= iVar7) {
        iVar7 = iVar6;
      }
      iVar6 = iVar7;
      if (iVar7 < iVar1) {
        iVar6 = iVar1;
      }
      goto LAB_00419d25;
    }
  }
  else {
LAB_00419d25:
    if (-1 < iVar6) {
      QWidgetLineControl::selectWordAtPos((QWidgetLineControl *)this_00->control,iVar6);
    }
  }
  iVar6 = QApplication::doubleClickInterval();
  QBasicTimer::start(&this_00->tripleClickTimer,(long)iVar6 * 1000000,1,this);
  auVar11 = QEventPoint::position();
  dVar10 = (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._0_8_;
  dVar9 = dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  QVar8.xp.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                              ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar9);
  dVar10 = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar11._8_8_;
  dVar9 = dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  QVar8.yp.m_i = (int)(double)(-(ulong)(2147483647.0 < dVar10) & 0x41dfffffffc00000 |
                              ~-(ulong)(2147483647.0 < dVar10) & (ulong)dVar9);
  this_00->tripleClick = QVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
LAB_00419e12:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseDoubleClickEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);

    if (e->button() == Qt::LeftButton) {
        int position = d->xToPos(e->position().toPoint().x());

        // exit composition mode
#ifndef QT_NO_IM
        if (d->control->composeMode()) {
            int preeditPos = d->control->cursor();
            int posInPreedit = position - d->control->cursor();
            int preeditLength = d->control->preeditAreaText().size();
            bool positionOnPreedit = false;

            if (posInPreedit >= 0 && posInPreedit <= preeditLength)
                positionOnPreedit = true;

            int textLength = d->control->end();
            d->control->commitPreedit();
            int sizeChange = d->control->end() - textLength;

            if (positionOnPreedit) {
                if (sizeChange == 0)
                    position = -1; // cancel selection, word disappeared
                else
                    // ensure not selecting after preedit if event happened there
                    position = qBound(preeditPos, position, preeditPos + sizeChange);
            } else if (position > preeditPos) {
                // adjust positions after former preedit by how much text changed
                position += (sizeChange - preeditLength);
            }
        }
#endif

        if (position >= 0)
            d->control->selectWordAtPos(position);

        d->tripleClickTimer.start(QApplication::doubleClickInterval(), this);
        d->tripleClick = e->position().toPoint();
    } else {
        d->sendMouseEventToInputContext(e);
    }
}